

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3raster.cpp
# Opt level: O0

bool32 rw::gl3::rasterFromImage(Raster *raster,Image *image)

{
  undefined1 uVar1;
  undefined1 uVar2;
  undefined1 uVar3;
  FILE *__stream;
  bool32 bVar4;
  char *pcVar5;
  bool bVar6;
  uint8 *local_70;
  uint8 *rasrow;
  uint8 *imgrow;
  int y;
  int x;
  uint8 *imgpixels;
  uint8 *pixels;
  undefined4 uStack_40;
  bool unlock;
  Error _e;
  int32 format;
  Gl3Raster *natras;
  Image *truecolimg;
  _func_void_uint8_ptr_uint8_ptr *conv;
  Image *image_local;
  Raster *raster_local;
  
  if ((raster->type & 0xfU) != 4) {
    return 0;
  }
  natras = (Gl3Raster *)0x0;
  conv = (_func_void_uint8_ptr_uint8_ptr *)image;
  if (image->depth < 9) {
    natras = (Gl3Raster *)Image::create(image->width,image->height,image->depth);
    *(uint8 **)&natras->filterMode = image->pixels;
    uVar1 = *(undefined1 *)((long)&image->stride + 1);
    uVar2 = *(undefined1 *)((long)&image->stride + 2);
    uVar3 = *(undefined1 *)((long)&image->stride + 3);
    natras->isCompressed = (bool)*(undefined1 *)&image->stride;
    natras->hasAlpha = (bool)uVar1;
    natras->autogenMipmap = (bool)uVar2;
    natras->numLevels = uVar3;
    *(uint8 **)&natras->fbo = image->palette;
    Image::unpalettize((Image *)natras,false);
    conv = (_func_void_uint8_ptr_uint8_ptr *)natras;
  }
  register0x00000000 = (long)&raster->platform + (long)nativeRasterOffset;
  _e.plugin = raster->format & 0xf00;
  switch(*(undefined4 *)(conv + 0xc)) {
  case 4:
  case 8:
  default:
LAB_00124823:
    pixels._4_4_ = 0xb00;
    uStack_40 = 0x8000000a;
    fprintf(_stderr,"%s:%d: ",
            "/workspace/llm4binary/github/license_c_cmakelists/aap[P]librw/src/gl/gl3raster.cpp",
            0x2b6);
    __stream = _stderr;
    pcVar5 = dbgsprint(0x8000000a);
    fprintf(__stream,"%s\n",pcVar5);
    setError((Error *)((long)&pixels + 4));
    raster_local._4_4_ = 0;
    break;
  case 0x10:
    if (gl3Caps != 0) {
      truecolimg = (Image *)conv_RGBA8888_from_ARGB1555;
      goto LAB_00124899;
    }
    if (_e.plugin == 0x100) {
      truecolimg = (Image *)conv_RGBA5551_from_ARGB1555;
      goto LAB_00124899;
    }
    goto LAB_00124823;
  case 0x18:
    if (gl3Caps == 0) {
      if (_e.plugin == 0x500) {
        truecolimg = (Image *)conv_RGBA8888_from_RGB888;
      }
      else {
        if (_e.plugin != 0x600) goto LAB_00124823;
        truecolimg = (Image *)conv_RGB888_from_RGB888;
      }
    }
    else {
      truecolimg = (Image *)conv_RGBA8888_from_RGB888;
    }
    goto LAB_00124899;
  case 0x20:
    if (gl3Caps == 0) {
      if (_e.plugin == 0x500) {
        truecolimg = (Image *)conv_RGBA8888_from_RGBA8888;
      }
      else {
        if (_e.plugin != 0x600) goto LAB_00124823;
        truecolimg = (Image *)conv_RGB888_from_RGB888;
      }
    }
    else {
      truecolimg = (Image *)conv_RGBA8888_from_RGBA8888;
    }
LAB_00124899:
    bVar4 = Image::hasAlpha((Image *)conv);
    *(bool *)(stack0xffffffffffffffc8 + 0x15) = bVar4 != 0;
    pixels._3_1_ = 0;
    bVar6 = raster->pixels == (uint8 *)0x0;
    if (bVar6) {
      Raster::lock(raster,0,5);
    }
    imgpixels = raster->pixels;
    pixels._3_1_ = bVar6;
    for (imgrow._0_4_ = 0; (int)imgrow < *(int *)(conv + 8); imgrow._0_4_ = (int)imgrow + 1) {
      local_70 = imgpixels;
      for (imgrow._4_4_ = 0; imgrow._4_4_ < *(int *)(conv + 4); imgrow._4_4_ = imgrow._4_4_ + 1) {
        (*(code *)truecolimg)(local_70);
        local_70 = local_70 + *(int *)(stack0xffffffffffffffc8 + 0xc);
      }
      imgpixels = imgpixels + raster->stride;
    }
    if ((pixels._3_1_ & 1) != 0) {
      Raster::unlock(raster,0);
    }
    if (natras != (Gl3Raster *)0x0) {
      Image::destroy((Image *)natras);
    }
    raster_local._4_4_ = 1;
  }
  return raster_local._4_4_;
}

Assistant:

bool32
rasterFromImage(Raster *raster, Image *image)
{
	if((raster->type&0xF) != Raster::TEXTURE)
		return 0;

	void (*conv)(uint8 *out, uint8 *in) = nil;

	// Unpalettize image if necessary but don't change original
	Image *truecolimg = nil;
	if(image->depth <= 8){
		truecolimg = Image::create(image->width, image->height, image->depth);
		truecolimg->pixels = image->pixels;
		truecolimg->stride = image->stride;
		truecolimg->palette = image->palette;
		truecolimg->unpalettize();
		image = truecolimg;
	}

	Gl3Raster *natras = GETGL3RASTEREXT(raster);
	int32 format = raster->format&0xF00;
	assert(!natras->isCompressed);
	switch(image->depth){
	case 32:
		if(gl3Caps.gles)
			conv = conv_RGBA8888_from_RGBA8888;
		else if(format == Raster::C8888)
			conv = conv_RGBA8888_from_RGBA8888;
		else if(format == Raster::C888)
			conv = conv_RGB888_from_RGB888;
		else
			goto err;
		break;
	case 24:
		if(gl3Caps.gles)
			conv = conv_RGBA8888_from_RGB888;
		else if(format == Raster::C8888)
			conv = conv_RGBA8888_from_RGB888;
		else if(format == Raster::C888)
			conv = conv_RGB888_from_RGB888;
		else
			goto err;
		break;
	case 16:
		if(gl3Caps.gles)
			conv = conv_RGBA8888_from_ARGB1555;
		else if(format == Raster::C1555)
			conv = conv_RGBA5551_from_ARGB1555;
		else
			goto err;
		break;

	case 8:
	case 4:
	default:
	err:
		RWERROR((ERR_INVRASTER));
		return 0;
	}

	natras->hasAlpha = image->hasAlpha();

	bool unlock = false;
	if(raster->pixels == nil){
		raster->lock(0, Raster::LOCKWRITE|Raster::LOCKNOFETCH);
		unlock = true;
	}

	uint8 *pixels = raster->pixels;
	assert(pixels);
	uint8 *imgpixels = image->pixels + (image->height-1)*image->stride;

	int x, y;
	assert(image->width == raster->width);
	assert(image->height == raster->height);
	for(y = 0; y < image->height; y++){
		uint8 *imgrow = imgpixels;
		uint8 *rasrow = pixels;
		for(x = 0; x < image->width; x++){
			conv(rasrow, imgrow);
			imgrow += image->bpp;
			rasrow += natras->bpp;
		}
		imgpixels -= image->stride;
		pixels += raster->stride;
	}
	if(unlock)
		raster->unlock(0);

	if(truecolimg)
		truecolimg->destroy();

	return 1;
}